

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

iterator __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::erase(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
        *this,iterator it)

{
  long lVar1;
  iterator it_00;
  QVLABase<QDialogButtonBox::StandardButton> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  iterator iVar2;
  containers *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffffa0;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QVLABase<QDialogButtonBox::StandardButton> *)(in_RDI + 0x58);
  iVar2.i = (size_type)this_00;
  iVar2.c = in_stack_ffffffffffffff88;
  toValuesIterator((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                    *)0x6760d4,iVar2);
  QVLABase<QDialogButtonBox::StandardButton>::erase
            (this_00,(const_iterator)in_stack_ffffffffffffff88);
  it_00.i = (size_type)this_00;
  it_00.c = in_stack_ffffffffffffff88;
  toKeysIterator((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                  *)0x6760ff,it_00);
  QVLABase<QPushButton_*>::erase
            ((QVLABase<QPushButton_*> *)this_00,(const_iterator)in_stack_ffffffffffffff88);
  iVar2 = fromKeysIterator(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(iterator it)
    {
        c.values.erase(toValuesIterator(it));
        return fromKeysIterator(c.keys.erase(toKeysIterator(it)));
    }